

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Thing_Destroy(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                    int arg4)

{
  bool bVar1;
  AActor *pAVar2;
  int iVar3;
  AActor *pAVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  DAngle angle;
  DAngle angle_00;
  FName local_60;
  FName local_5c;
  undefined8 local_58;
  undefined8 local_50;
  FActorIterator iterator;
  
  if (arg2 == 0 && arg0 == 0) {
    P_Massacre();
  }
  else {
    if (arg0 != 0) {
      iterator.base = (AActor *)0x0;
      iterator.id = arg0;
      pAVar2 = FActorIterator::Next(&iterator);
      while (pAVar4 = pAVar2, pAVar4 != (AActor *)0x0) {
        pAVar2 = FActorIterator::Next(&iterator);
        if ((((pAVar4->flags).Value & 4) != 0) &&
           ((angle.Degrees = extraout_XMM0_Qa, arg2 == 0 ||
            (bVar1 = FTagManager::SectorHasTag(&tagManager,pAVar4->Sector,arg2),
            angle.Degrees = extraout_XMM0_Qa_00, bVar1)))) {
          iVar3 = 1000000;
          if (arg1 == 0) {
            iVar3 = pAVar4->health;
          }
          local_60.Index = 0;
          local_58 = 0;
          P_DamageMobj(pAVar4,(AActor *)0x0,it,iVar3,&local_60,0,angle);
        }
      }
      return 1;
    }
    TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&iterator,0x80);
    pAVar2 = (AActor *)FThinkerIterator::Next((FThinkerIterator *)&iterator);
    while (pAVar4 = pAVar2, pAVar4 != (AActor *)0x0) {
      pAVar2 = (AActor *)FThinkerIterator::Next((FThinkerIterator *)&iterator);
      if ((((pAVar4->flags).Value & 4) != 0) &&
         (bVar1 = FTagManager::SectorHasTag(&tagManager,pAVar4->Sector,arg2), bVar1)) {
        iVar3 = 1000000;
        if (arg1 == 0) {
          iVar3 = pAVar4->health;
        }
        local_5c.Index = 0;
        local_50 = 0;
        P_DamageMobj(pAVar4,(AActor *)0x0,it,iVar3,&local_5c,0,angle_00);
      }
    }
  }
  return 1;
}

Assistant:

FUNC(LS_Thing_Destroy)
// Thing_Destroy (tid, extreme, tag)
{
	AActor *actor;

	if (arg0 == 0 && arg2 == 0)
	{
		P_Massacre ();
	}
	else if (arg0 == 0)
	{
		TThinkerIterator<AActor> iterator;
		
		actor = iterator.Next ();
		while (actor)
		{
			AActor *temp = iterator.Next ();
			if (actor->flags & MF_SHOOTABLE && tagManager.SectorHasTag(actor->Sector, arg2))
				P_DamageMobj (actor, NULL, it, arg1 ? TELEFRAG_DAMAGE : actor->health, NAME_None);
			actor = temp;
		}
	}
	else
	{
		FActorIterator iterator (arg0);

		actor = iterator.Next ();
		while (actor)
		{
			AActor *temp = iterator.Next ();
			if (actor->flags & MF_SHOOTABLE && (arg2 == 0 || tagManager.SectorHasTag(actor->Sector, arg2)))
				P_DamageMobj (actor, NULL, it, arg1 ? TELEFRAG_DAMAGE : actor->health, NAME_None);
			actor = temp;
		}
	}
	return true;
}